

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_avx2.c
# Opt level: O0

void calc_ab(int32_t *A,int32_t *B,int32_t *C,int32_t *D,int width,int height,int buf_stride,
            int bit_depth,int sgr_params_idx,int radius_idx)

{
  undefined1 auVar1 [16];
  __m256i v;
  __m256i v_00;
  __m256i sum2_00;
  __m256i sum1_00;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  long lVar12;
  int in_R8D;
  int in_R9D;
  undefined8 uVar13;
  undefined1 auVar14 [32];
  longlong lVar20;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar21;
  undefined1 auVar17 [64];
  __m256i b_int;
  __m256i a_comp_over_n;
  __m256i a_complement;
  __m256i a_res;
  __m256i z;
  __m256i p;
  int idx_1;
  __m256i sum2;
  __m256i sum1;
  int32_t *Dij;
  int32_t *Cij;
  int j;
  int i;
  __m128i shift;
  int idx;
  __m256i mask [8];
  __m128i ones32;
  __m256i rnd_res;
  __m256i rnd_z;
  __m256i one_over_n;
  __m256i s;
  int n;
  int r;
  sgr_params_type *params;
  undefined8 in_stack_fffffffffffff7a0;
  undefined4 uVar22;
  undefined4 uVar23;
  uint in_stack_fffffffffffff7b0;
  int iVar24;
  void *a;
  undefined1 in_stack_fffffffffffff7c0 [32];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined1 auVar25 [16];
  undefined1 in_stack_fffffffffffff860 [32];
  int in_stack_fffffffffffff8b0;
  int in_stack_fffffffffffff8b4;
  undefined4 in_stack_fffffffffffff8b8;
  longlong lVar26;
  undefined8 uVar27;
  undefined8 uStack_708;
  int local_6e8;
  int local_6e4;
  int local_6c4;
  undefined8 local_6c0 [34];
  undefined1 auStack_5b0 [16];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  int local_510;
  int local_50c;
  sgr_params_type *local_508;
  int local_500;
  int local_4fc;
  undefined4 local_4d4;
  undefined4 local_4d0;
  undefined4 local_4cc;
  uint local_4c8;
  uint local_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [16];
  undefined1 auStack_490 [16];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined1 local_420 [32];
  undefined8 local_400;
  undefined8 uStack_3f8;
  longlong lStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  longlong lStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_330 [16];
  undefined4 local_320;
  undefined4 local_31c;
  undefined4 local_318;
  undefined4 local_314;
  undefined1 local_310 [16];
  uint local_2f4;
  undefined1 local_2f0 [16];
  ulong local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  longlong lStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  longlong lStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined4 local_1e4;
  undefined1 local_1e0 [32];
  undefined4 local_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  uint local_160;
  uint local_15c;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  uint local_120;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined1 local_80 [32];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  local_508 = av1_sgr_params + bit_depth;
  local_50c = local_508->r[sgr_params_idx];
  local_510 = local_50c * 2 + 1;
  local_510 = local_510 * local_510;
  local_4c4 = *(uint *)((long)bit_depth * 0x10 + 0x19d2a18 + (long)sgr_params_idx * 4);
  auVar25 = vpinsrd_avx(ZEXT416(local_4c4),local_4c4,1);
  auVar25 = vpinsrd_avx(auVar25,local_4c4,2);
  local_180 = vpinsrd_avx(auVar25,local_4c4,3);
  auVar25 = vpinsrd_avx(ZEXT416(local_4c4),local_4c4,1);
  auVar25 = vpinsrd_avx(auVar25,local_4c4,2);
  auStack_170 = vpinsrd_avx(auVar25,local_4c4,3);
  local_540 = local_180._0_8_;
  uStack_538 = local_180._8_8_;
  uStack_530 = auStack_170._0_8_;
  uStack_528 = auStack_170._8_8_;
  local_4c8 = av1_one_by_x[local_510 + -1];
  auVar25 = vpinsrd_avx(ZEXT416(local_4c8),local_4c8,1);
  auVar25 = vpinsrd_avx(auVar25,local_4c8,2);
  local_140 = vpinsrd_avx(auVar25,local_4c8,3);
  auVar25 = vpinsrd_avx(ZEXT416(local_4c8),local_4c8,1);
  auVar25 = vpinsrd_avx(auVar25,local_4c8,2);
  auStack_130 = vpinsrd_avx(auVar25,local_4c8,3);
  local_560 = local_140._0_8_;
  uStack_558 = local_140._8_8_;
  uStack_550 = auStack_130._0_8_;
  uStack_548 = auStack_130._8_8_;
  uVar13 = local_140._0_8_;
  uVar18 = local_140._8_8_;
  uVar19 = auStack_130._0_8_;
  uVar21 = auStack_130._8_8_;
  local_500 = in_R9D;
  local_4fc = in_R8D;
  local_160 = local_4c4;
  local_15c = local_4c4;
  local_158 = local_4c4;
  local_154 = local_4c4;
  local_150 = local_4c4;
  local_14c = local_4c4;
  local_148 = local_4c4;
  local_144 = local_4c4;
  local_120 = local_4c8;
  local_11c = local_4c8;
  local_118 = local_4c8;
  local_114 = local_4c8;
  local_110 = local_4c8;
  local_10c = local_4c8;
  local_108 = local_4c8;
  local_104 = local_4c8;
  round_for_shift(in_stack_fffffffffffff7b0);
  local_580 = uVar13;
  uStack_578 = uVar18;
  uStack_570 = uVar19;
  uStack_568 = uVar21;
  round_for_shift(in_stack_fffffffffffff7b0);
  local_314 = 0;
  local_318 = 0;
  local_31c = 0xffffffff;
  local_320 = 0xffffffff;
  auVar25 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
  auVar25 = vpinsrd_avx(auVar25,0,2);
  auStack_5b0 = vpinsrd_avx(auVar25,0,3);
  auVar17 = ZEXT1664(auStack_5b0);
  for (local_6c4 = 0; local_6c4 < 8; local_6c4 = local_6c4 + 1) {
    local_2f4 = (8 - local_6c4) * 8;
    local_310._4_4_ = 0;
    local_310._0_4_ = local_2f4;
    local_2d0 = auStack_5b0._0_8_;
    uStack_2c8 = auStack_5b0._8_8_;
    local_2e0 = local_310._0_8_;
    uStack_2d8 = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_310._0_8_;
    local_2f0 = vpsrlq_avx(auStack_5b0,auVar1);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_2f0._0_8_;
    auVar14 = vpmovsxbd_avx2(auVar25);
    auVar17 = ZEXT3264(auVar14);
    *(undefined1 (*) [32])(local_6c0 + (long)local_6c4 * 4) = auVar14;
    local_310 = ZEXT416(local_2f4);
  }
  local_5a0 = uVar13;
  uStack_598 = uVar18;
  uStack_590 = uVar19;
  uStack_588 = uVar21;
  local_330 = auStack_5b0;
  for (local_6e4 = -1; local_6e4 < local_500 + 1; local_6e4 = local_6e4 + 1) {
    for (local_6e8 = -1; a = in_stack_fffffffffffff7c0._16_8_,
        auVar25 = in_stack_fffffffffffff860._8_16_, auVar14 = auVar17._0_32_,
        local_6e8 < local_4fc + 1; local_6e8 = local_6e8 + 8) {
      boxsum_from_ii(in_stack_fffffffffffff860._16_8_,in_stack_fffffffffffff860._12_4_,
                     in_stack_fffffffffffff860._8_4_);
      uVar13 = auVar14._0_8_;
      uVar18 = auVar14._8_8_;
      lVar20 = auVar14._16_8_;
      uStack_708 = auVar14._24_8_;
      boxsum_from_ii(auVar25._8_8_,auVar25._4_4_,auVar25._0_4_);
      if ((local_4fc + 1) - local_6e8 < 9) {
        iVar24 = (local_4fc + 1) - local_6e8;
      }
      else {
        iVar24 = 8;
      }
      uVar19 = auVar14._0_8_;
      uVar21 = auVar14._8_8_;
      lVar26 = auVar14._16_8_;
      uVar27 = auVar14._24_8_;
      if (iVar24 < 8) {
        lVar12 = (long)iVar24;
        local_260 = local_6c0[lVar12 * 4];
        uStack_258 = local_6c0[lVar12 * 4 + 1];
        uStack_250 = local_6c0[lVar12 * 4 + 2];
        uStack_248 = local_6c0[lVar12 * 4 + 3];
        local_280 = uVar13;
        uStack_278 = uVar18;
        lStack_270 = lVar20;
        uStack_268 = uStack_708;
        auVar9._8_8_ = local_6c0[lVar12 * 4 + 1];
        auVar9._0_8_ = local_6c0[lVar12 * 4];
        auVar9._16_8_ = local_6c0[lVar12 * 4 + 2];
        auVar9._24_8_ = local_6c0[lVar12 * 4 + 3];
        auVar8._8_8_ = uVar18;
        auVar8._0_8_ = uVar13;
        auVar8._16_8_ = lVar20;
        auVar8._24_8_ = uStack_708;
        auVar15 = vpand_avx2(auVar9,auVar8);
        uVar13 = auVar15._0_8_;
        uVar18 = auVar15._8_8_;
        lVar20 = auVar15._16_8_;
        uStack_708 = auVar15._24_8_;
        lVar12 = (long)iVar24;
        local_2a0 = local_6c0[lVar12 * 4];
        uStack_298 = local_6c0[lVar12 * 4 + 1];
        uStack_290 = local_6c0[lVar12 * 4 + 2];
        uStack_288 = local_6c0[lVar12 * 4 + 3];
        auVar15._8_8_ = uStack_298;
        auVar15._0_8_ = local_2a0;
        auVar15._16_8_ = uStack_290;
        auVar15._24_8_ = uStack_288;
        auVar15 = vpand_avx2(auVar15,auVar14);
        uVar19 = auVar15._0_8_;
        uVar21 = auVar15._8_8_;
        lVar26 = auVar15._16_8_;
        uVar27 = auVar15._24_8_;
        local_2c0 = auVar14._0_8_;
        uStack_2b8 = auVar14._8_8_;
        lStack_2b0 = auVar14._16_8_;
        uStack_2a8 = auVar14._24_8_;
      }
      sum1_00[1] = uVar13;
      sum1_00[0] = uVar27;
      sum1_00[2] = uVar18;
      sum1_00[3] = lVar20;
      sum2_00[0]._4_4_ = iVar24;
      sum2_00[0]._0_4_ = in_stack_fffffffffffff8b8;
      sum2_00[1] = uVar19;
      sum2_00[2] = uVar21;
      sum2_00[3] = lVar26;
      uVar19 = uStack_708;
      uVar21 = uVar13;
      uVar27 = uVar18;
      lVar26 = lVar20;
      compute_p(sum1_00,sum2_00,in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0);
      local_3c0 = local_540;
      uStack_3b8 = uStack_538;
      uStack_3b0 = uStack_530;
      uStack_3a8 = uStack_528;
      auVar6._8_8_ = uVar18;
      auVar6._0_8_ = uVar13;
      auVar6._16_8_ = lVar20;
      auVar6._24_8_ = uVar19;
      auVar5._8_8_ = uStack_538;
      auVar5._0_8_ = local_540;
      auVar5._16_8_ = uStack_530;
      auVar5._24_8_ = uStack_528;
      local_420 = vpmulld_avx2(auVar6,auVar5);
      local_440 = local_580;
      uStack_438 = uStack_578;
      uStack_430 = uStack_570;
      uStack_428 = uStack_568;
      auVar3._8_8_ = uStack_578;
      auVar3._0_8_ = local_580;
      auVar3._16_8_ = uStack_570;
      auVar3._24_8_ = uStack_568;
      local_1a0 = vpaddd_avx2(local_420,auVar3);
      local_1a4 = 0x14;
      local_220 = vpsrld_avx2(local_1a0,ZEXT416(0x14));
      local_4cc = 0xff;
      uVar22 = 0xff;
      local_c4 = 0xff;
      local_c8 = 0xff;
      local_cc = 0xff;
      local_d0 = 0xff;
      local_d4 = 0xff;
      local_d8 = 0xff;
      local_dc = 0xff;
      local_e0 = 0xff;
      auVar25 = vpinsrd_avx(ZEXT416(0xff),0xff,1);
      auVar25 = vpinsrd_avx(auVar25,0xff,2);
      local_100 = vpinsrd_avx(auVar25,0xff,3);
      auVar25 = vpinsrd_avx(ZEXT416(0xff),0xff,1);
      auVar25 = vpinsrd_avx(auVar25,0xff,2);
      auStack_f0 = vpinsrd_avx(auVar25,0xff,3);
      local_240 = local_100._0_8_;
      uStack_238 = local_100._8_8_;
      uStack_230 = auStack_f0._0_8_;
      uStack_228 = auStack_f0._8_8_;
      auVar10._16_8_ = auStack_f0._0_8_;
      auVar10._0_16_ = local_100;
      auVar10._24_8_ = auStack_f0._8_8_;
      in_stack_fffffffffffff860 = vpminsd_avx2(local_220,auVar10);
      local_4d0 = 0xffffffff;
      uVar23 = 0xffffffff;
      local_84 = 0xffffffff;
      local_88 = 0xffffffff;
      local_8c = 0xffffffff;
      local_90 = 0xffffffff;
      local_94 = 0xffffffff;
      local_98 = 0xffffffff;
      local_9c = 0xffffffff;
      local_a0 = 0xffffffff;
      auVar25 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
      auVar25 = vpinsrd_avx(auVar25,0xffffffff,2);
      local_c0 = vpinsrd_avx(auVar25,0xffffffff,3);
      auVar25 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
      auVar25 = vpinsrd_avx(auVar25,0xffffffff,2);
      auStack_b0 = vpinsrd_avx(auVar25,0xffffffff,3);
      auVar11._16_16_ = auStack_b0;
      auVar11._0_16_ = local_c0;
      auVar15 = vpgatherdd(ZEXT832(0) << 0x20,auVar11);
      v[1] = in_stack_fffffffffffff7a0;
      v[0] = 0x16c8d7a;
      v[2]._0_4_ = 0xff;
      v[2]._4_4_ = 0xffffffff;
      v[3]._0_4_ = in_stack_fffffffffffff7b0;
      v[3]._4_4_ = iVar24;
      local_3a0 = uVar13;
      uStack_398 = uVar18;
      lStack_390 = lVar20;
      uStack_388 = uVar19;
      yy_storeu_256(a,v);
      local_4d4 = 0x100;
      in_stack_fffffffffffff7b0 = 0x100;
      local_34 = 0x100;
      local_38 = 0x100;
      local_3c = 0x100;
      local_40 = 0x100;
      local_44 = 0x100;
      local_48 = 0x100;
      local_4c = 0x100;
      local_50 = 0x100;
      auVar25 = vpinsrd_avx(ZEXT416(0x100),0x100,1);
      auVar25 = vpinsrd_avx(auVar25,0x100,2);
      auVar25 = vpinsrd_avx(auVar25,0x100,3);
      auVar1 = vpinsrd_avx(ZEXT416(0x100),0x100,1);
      auVar1 = vpinsrd_avx(auVar1,0x100,2);
      auVar1 = vpinsrd_avx(auVar1,0x100,3);
      auVar16._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar1;
      auVar16._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar25;
      local_80._16_8_ = auVar16._16_8_;
      local_80._24_8_ = auVar16._24_8_;
      local_7c0 = auVar15._0_8_;
      uStack_7b8 = auVar15._8_8_;
      uStack_7b0 = auVar15._16_8_;
      uStack_7a8 = auVar15._24_8_;
      local_4c0 = local_7c0;
      uStack_4b8 = uStack_7b8;
      uStack_4b0 = uStack_7b0;
      uStack_4a8 = uStack_7a8;
      auVar14._16_8_ = local_80._16_8_;
      auVar14._0_16_ = auVar16._0_16_;
      auVar14._24_8_ = local_80._24_8_;
      auVar14 = vpsubd_avx2(auVar14,auVar15);
      local_7e0 = auVar14._0_8_;
      uStack_7d8 = auVar14._8_8_;
      uStack_7d0 = auVar14._16_8_;
      uStack_7c8 = auVar14._24_8_;
      local_360 = local_7e0;
      uStack_358 = uStack_7d8;
      uStack_350 = uStack_7d0;
      uStack_348 = uStack_7c8;
      local_380 = local_560;
      uStack_378 = uStack_558;
      uStack_370 = uStack_550;
      uStack_368 = uStack_548;
      auVar7._8_8_ = uStack_558;
      auVar7._0_8_ = local_560;
      auVar7._16_8_ = uStack_550;
      auVar7._24_8_ = uStack_548;
      auVar14 = vpmaddwd_avx2(auVar14,auVar7);
      local_800 = auVar14._0_8_;
      uStack_7f8 = auVar14._8_8_;
      uStack_7f0 = auVar14._16_8_;
      uStack_7e8 = auVar14._24_8_;
      local_3e0 = local_800;
      uStack_3d8 = uStack_7f8;
      uStack_3d0 = uStack_7f0;
      uStack_3c8 = uStack_7e8;
      uStack_3e8 = uStack_708;
      auVar4._8_8_ = uVar27;
      auVar4._0_8_ = uVar21;
      auVar4._16_8_ = lVar26;
      auVar4._24_8_ = uStack_708;
      auVar14 = vpmulld_avx2(auVar14,auVar4);
      local_820 = auVar14._0_8_;
      uStack_818 = auVar14._8_8_;
      uStack_810 = auVar14._16_8_;
      uStack_808 = auVar14._24_8_;
      local_460 = local_820;
      uStack_458 = uStack_818;
      uStack_450 = uStack_810;
      uStack_448 = uStack_808;
      local_480 = local_5a0;
      uStack_478 = uStack_598;
      uStack_470 = uStack_590;
      uStack_468 = uStack_588;
      auVar2._8_8_ = uStack_598;
      auVar2._0_8_ = local_5a0;
      auVar2._16_8_ = uStack_590;
      auVar2._24_8_ = uStack_588;
      local_1e0 = vpaddd_avx2(auVar14,auVar2);
      local_1e4 = 0xc;
      in_stack_fffffffffffff7c0 = vpsrld_avx2(local_1e0,ZEXT416(0xc));
      auVar17 = ZEXT3264(in_stack_fffffffffffff7c0);
      v_00[1] = in_stack_fffffffffffff7a0;
      v_00[0] = 0x16c8f9c;
      v_00[2]._0_4_ = uVar22;
      v_00[2]._4_4_ = uVar23;
      v_00[3]._0_4_ = 0x100;
      v_00[3]._4_4_ = iVar24;
      local_400 = uVar21;
      uStack_3f8 = uVar27;
      lStack_3f0 = lVar26;
      local_80 = auVar16;
      local_4a0 = auVar16._0_16_;
      auStack_490 = auVar16._16_16_;
      yy_storeu_256(in_stack_fffffffffffff7c0._16_8_,v_00);
    }
  }
  return;
}

Assistant:

static void calc_ab(int32_t *A, int32_t *B, const int32_t *C, const int32_t *D,
                    int width, int height, int buf_stride, int bit_depth,
                    int sgr_params_idx, int radius_idx) {
  const sgr_params_type *const params = &av1_sgr_params[sgr_params_idx];
  const int r = params->r[radius_idx];
  const int n = (2 * r + 1) * (2 * r + 1);
  const __m256i s = _mm256_set1_epi32(params->s[radius_idx]);
  // one_over_n[n-1] is 2^12/n, so easily fits in an int16
  const __m256i one_over_n = _mm256_set1_epi32(av1_one_by_x[n - 1]);

  const __m256i rnd_z = round_for_shift(SGRPROJ_MTABLE_BITS);
  const __m256i rnd_res = round_for_shift(SGRPROJ_RECIP_BITS);

  // Set up masks
  const __m128i ones32 = _mm_set_epi32(0, 0, ~0, ~0);
  __m256i mask[8];
  for (int idx = 0; idx < 8; idx++) {
    const __m128i shift = _mm_cvtsi32_si128(8 * (8 - idx));
    mask[idx] = _mm256_cvtepi8_epi32(_mm_srl_epi64(ones32, shift));
  }

  for (int i = -1; i < height + 1; ++i) {
    for (int j = -1; j < width + 1; j += 8) {
      const int32_t *Cij = C + i * buf_stride + j;
      const int32_t *Dij = D + i * buf_stride + j;

      __m256i sum1 = boxsum_from_ii(Dij, buf_stride, r);
      __m256i sum2 = boxsum_from_ii(Cij, buf_stride, r);

      // When width + 2 isn't a multiple of 8, sum1 and sum2 will contain
      // some uninitialised data in their upper words. We use a mask to
      // ensure that these bits are set to 0.
      int idx = AOMMIN(8, width + 1 - j);
      assert(idx >= 1);

      if (idx < 8) {
        sum1 = _mm256_and_si256(mask[idx], sum1);
        sum2 = _mm256_and_si256(mask[idx], sum2);
      }

      const __m256i p = compute_p(sum1, sum2, bit_depth, n);

      const __m256i z = _mm256_min_epi32(
          _mm256_srli_epi32(_mm256_add_epi32(_mm256_mullo_epi32(p, s), rnd_z),
                            SGRPROJ_MTABLE_BITS),
          _mm256_set1_epi32(255));

      const __m256i a_res = _mm256_i32gather_epi32(av1_x_by_xplus1, z, 4);

      yy_storeu_256(A + i * buf_stride + j, a_res);

      const __m256i a_complement =
          _mm256_sub_epi32(_mm256_set1_epi32(SGRPROJ_SGR), a_res);

      // sum1 might have lanes greater than 2^15, so we can't use madd to do
      // multiplication involving sum1. However, a_complement and one_over_n
      // are both less than 256, so we can multiply them first.
      const __m256i a_comp_over_n = _mm256_madd_epi16(a_complement, one_over_n);
      const __m256i b_int = _mm256_mullo_epi32(a_comp_over_n, sum1);
      const __m256i b_res = _mm256_srli_epi32(_mm256_add_epi32(b_int, rnd_res),
                                              SGRPROJ_RECIP_BITS);

      yy_storeu_256(B + i * buf_stride + j, b_res);
    }
  }
}